

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::truncSatToUI64(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  long local_28;
  double local_20;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    Literal((Literal *)&local_38.func,this);
    if (local_28 != 5) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x169,"Literal wasm::Literal::castToI64()");
    }
    local_40 = 3;
    local_50.i64 = CONCAT44(local_38.i64._4_4_,local_38.i32);
    local_20 = (double)local_50.i64;
    if (!NAN((double)local_50.i64)) {
      bVar2 = isInRangeI64TruncU(local_50.i64);
      if (bVar2) {
        dVar6 = ::trunc(local_20);
        uVar3 = (ulong)dVar6;
        uVar4 = (ulong)(dVar6 - 9.223372036854776e+18);
        goto LAB_00c43def;
      }
      goto joined_r0x00c43e01;
    }
  }
  else {
    if (uVar1 != 4) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x3b6);
    }
    Literal((Literal *)&local_38.func,this);
    if (local_28 != 4) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x162,"Literal wasm::Literal::castToI32()");
    }
    local_40 = 2;
    local_50.i32 = local_38.i32;
    local_20 = (double)CONCAT44(local_20._4_4_,local_38.i32);
    if (!NAN((float)local_38.i32)) {
      bVar2 = isInRangeI64TruncU(local_38.i32);
      local_38._4_4_ = local_38.i32;
      if (bVar2) {
        fVar5 = truncf(local_20._0_4_);
        uVar3 = (ulong)fVar5;
        uVar4 = (ulong)(fVar5 - 9.223372e+18);
LAB_00c43def:
        (__return_storage_ptr__->field_0).func.super_IString.str._M_len =
             uVar4 & (long)uVar3 >> 0x3f | uVar3;
        goto LAB_00c43e18;
      }
joined_r0x00c43e01:
      if (-1 < (int)local_38.i64._4_4_) {
        (__return_storage_ptr__->field_0).i64 = -1;
        goto LAB_00c43e18;
      }
    }
  }
  (__return_storage_ptr__->field_0).i64 = 0;
LAB_00c43e18:
  (__return_storage_ptr__->type).id = 3;
  ~Literal((Literal *)&local_50.func);
  ~Literal((Literal *)&local_38.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI64() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}